

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O0

void btDbvt::rayTest(btDbvtNode *root,btVector3 *rayFrom,btVector3 *rayTo,ICollide *policy)

{
  bool bVar1;
  btScalar *pbVar2;
  btVector3 *rayFrom_00;
  btDbvtNode **ppbVar3;
  btVector3 *pbVar4;
  long *in_RCX;
  btDbvtNode *in_RDI;
  btVector3 bVar5;
  uint result1;
  btScalar lambda_min;
  btScalar tmin;
  btDbvtNode *node;
  btVector3 bounds [2];
  int treshold;
  int depth;
  btAlignedObjectArray<const_btDbvtNode_*> stack;
  btVector3 resultNormal;
  btScalar lambda_max;
  uint signs [3];
  btVector3 rayDirectionInverse;
  btVector3 rayDir;
  btAlignedObjectArray<const_btDbvtNode_*> *in_stack_fffffffffffffe60;
  btDbvtNode *pbVar6;
  btVector3 *in_stack_fffffffffffffe68;
  btDbvtNode *in_stack_fffffffffffffe70;
  btDbvtNode **in_stack_fffffffffffffe78;
  int iVar7;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  btVector3 *this;
  btVector3 *bounds_00;
  btVector3 *raySign;
  btDbvtNode *rayInvDirection;
  btScalar local_10c;
  btScalar local_104;
  btScalar local_fc;
  btVector3 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  btVector3 bStack_b8;
  undefined8 local_a0;
  int local_98;
  int local_94;
  btAlignedObjectArray<const_btDbvtNode_*> local_90;
  btVector3 local_70;
  btVector3 local_60;
  btScalar local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  btVector3 local_40;
  btVector3 local_30;
  long *local_20;
  btDbvtNode *local_8;
  
  if (in_RDI != (btDbvtNode *)0x0) {
    local_20 = in_RCX;
    local_8 = in_RDI;
    bVar5 = operator-((btVector3 *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_30.m_floats._8_8_ = bVar5.m_floats._8_8_;
    local_30.m_floats._0_8_ = bVar5.m_floats._0_8_;
    btVector3::normalize((btVector3 *)in_stack_fffffffffffffe60);
    btVector3::btVector3(&local_40);
    pbVar2 = btVector3::operator_cast_to_float_(&local_30);
    if ((*pbVar2 != 0.0) || (NAN(*pbVar2))) {
      pbVar2 = btVector3::operator_cast_to_float_(&local_30);
      local_fc = 1.0 / *pbVar2;
    }
    else {
      local_fc = 1e+18;
    }
    pbVar2 = btVector3::operator_cast_to_float_(&local_40);
    *pbVar2 = local_fc;
    pbVar2 = btVector3::operator_cast_to_float_(&local_30);
    if ((pbVar2[1] != 0.0) || (NAN(pbVar2[1]))) {
      pbVar2 = btVector3::operator_cast_to_float_(&local_30);
      local_104 = 1.0 / pbVar2[1];
    }
    else {
      local_104 = 1e+18;
    }
    pbVar2 = btVector3::operator_cast_to_float_(&local_40);
    pbVar2[1] = local_104;
    pbVar2 = btVector3::operator_cast_to_float_(&local_30);
    if ((pbVar2[2] != 0.0) || (NAN(pbVar2[2]))) {
      pbVar2 = btVector3::operator_cast_to_float_(&local_30);
      local_10c = 1.0 / pbVar2[2];
    }
    else {
      local_10c = 1e+18;
    }
    pbVar2 = btVector3::operator_cast_to_float_(&local_40);
    pbVar2[2] = local_10c;
    pbVar2 = btVector3::operator_cast_to_float_(&local_40);
    local_4c = (uint)(*pbVar2 < 0.0);
    pbVar2 = btVector3::operator_cast_to_float_(&local_40);
    local_48 = (uint)(pbVar2[1] < 0.0);
    pbVar2 = btVector3::operator_cast_to_float_(&local_40);
    local_44 = (uint)(pbVar2[2] < 0.0);
    bVar5 = operator-((btVector3 *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_60.m_floats._8_8_ = bVar5.m_floats._8_8_;
    local_60.m_floats._0_8_ = bVar5.m_floats._0_8_;
    local_50 = btVector3::dot(&local_30,&local_60);
    btVector3::btVector3(&local_70);
    btAlignedObjectArray<const_btDbvtNode_*>::btAlignedObjectArray(in_stack_fffffffffffffe60);
    local_94 = 1;
    local_98 = 0x7e;
    local_a0 = 0;
    btAlignedObjectArray<const_btDbvtNode_*>::resize
              ((btAlignedObjectArray<const_btDbvtNode_*> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (btDbvtNode **)in_stack_fffffffffffffe70);
    rayFrom_00 = (btVector3 *)btAlignedObjectArray<const_btDbvtNode_*>::operator[](&local_90,0);
    *(btDbvtNode **)rayFrom_00->m_floats = local_8;
    bounds_00 = &bStack_b8;
    raySign = &local_d8;
    rayInvDirection = local_8;
    do {
      this = raySign;
      btVector3::btVector3(this);
      raySign = this + 1;
    } while (raySign != bounds_00);
    do {
      local_94 = local_94 + -1;
      ppbVar3 = btAlignedObjectArray<const_btDbvtNode_*>::operator[](&local_90,local_94);
      pbVar6 = *ppbVar3;
      pbVar4 = btDbvtAabbMm::Mins(&pbVar6->volume);
      local_d8.m_floats._0_8_ = *(undefined8 *)pbVar4->m_floats;
      local_d8.m_floats._8_8_ = *(undefined8 *)(pbVar4->m_floats + 2);
      pbVar4 = btDbvtAabbMm::Maxs(&pbVar6->volume);
      local_c8 = *(undefined8 *)pbVar4->m_floats;
      uStack_c0 = *(undefined8 *)(pbVar4->m_floats + 2);
      bVar1 = btRayAabb2(rayFrom_00,(btVector3 *)rayInvDirection,(uint *)raySign,bounds_00,
                         this->m_floats,(btScalar)((ulong)ppbVar3 >> 0x20),SUB84(ppbVar3,0));
      if (bVar1) {
        bVar1 = btDbvtNode::isinternal((btDbvtNode *)0x17f8c0);
        iVar7 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        if (bVar1) {
          if (local_98 < local_94) {
            btAlignedObjectArray<const_btDbvtNode_*>::size(&local_90);
            btAlignedObjectArray<const_btDbvtNode_*>::resize
                      ((btAlignedObjectArray<const_btDbvtNode_*> *)
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),iVar7,
                       (btDbvtNode **)in_stack_fffffffffffffe70);
            in_stack_fffffffffffffe84 = btAlignedObjectArray<const_btDbvtNode_*>::size(&local_90);
            local_98 = in_stack_fffffffffffffe84 + -2;
          }
          iVar7 = local_94;
          in_stack_fffffffffffffe70 = (pbVar6->field_2).childs[0];
          local_94 = local_94 + 1;
          in_stack_fffffffffffffe78 =
               btAlignedObjectArray<const_btDbvtNode_*>::operator[](&local_90,iVar7);
          iVar7 = local_94;
          *in_stack_fffffffffffffe78 = in_stack_fffffffffffffe70;
          pbVar6 = *(btDbvtNode **)((long)&pbVar6->field_2 + 8);
          local_94 = local_94 + 1;
          ppbVar3 = btAlignedObjectArray<const_btDbvtNode_*>::operator[](&local_90,iVar7);
          *ppbVar3 = pbVar6;
        }
        else {
          (**(code **)(*local_20 + 0x18))(local_20,pbVar6);
        }
      }
    } while (local_94 != 0);
    btAlignedObjectArray<const_btDbvtNode_*>::~btAlignedObjectArray
              ((btAlignedObjectArray<const_btDbvtNode_*> *)0x17fa32);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::rayTest(	const btDbvtNode* root,
								const btVector3& rayFrom,
								const btVector3& rayTo,
								DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root)
		{
			btVector3 rayDir = (rayTo-rayFrom);
			rayDir.normalize ();

			///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
			btVector3 rayDirectionInverse;
			rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
			rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
			rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
			unsigned int signs[3] = { rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};

			btScalar lambda_max = rayDir.dot(rayTo-rayFrom);

			btVector3 resultNormal;

			btAlignedObjectArray<const btDbvtNode*>	stack;

			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-2;

			stack.resize(DOUBLE_STACKSIZE);
			stack[0]=root;
			btVector3 bounds[2];
			do	{
				const btDbvtNode*	node=stack[--depth];

				bounds[0] = node->volume.Mins();
				bounds[1] = node->volume.Maxs();
				
				btScalar tmin=1.f,lambda_min=0.f;
				unsigned int result1 = btRayAabb2(rayFrom,rayDirectionInverse,signs,bounds,tmin,lambda_min,lambda_max);

#ifdef COMPARE_BTRAY_AABB2
				btScalar param=1.f;
				bool result2 = btRayAabb(rayFrom,rayTo,node->volume.Mins(),node->volume.Maxs(),param,resultNormal);
				btAssert(result1 == result2);
#endif //TEST_BTRAY_AABB2

				if(result1)
				{
					if(node->isinternal())
					{
						if(depth>treshold)
						{
							stack.resize(stack.size()*2);
							treshold=stack.size()-2;
						}
						stack[depth++]=node->childs[0];
						stack[depth++]=node->childs[1];
					}
					else
					{
						policy.Process(node);
					}
				}
			} while(depth);

		}
}